

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReparserTester.cpp
# Opt level: O2

void __thiscall psy::C::ReparserTester::case0014(ReparserTester *this)

{
  Expectation *pEVar1;
  initializer_list<psy::C::SyntaxKind> __l;
  allocator_type local_1ea;
  allocator<char> local_1e9;
  _Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> local_1e8;
  _Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> local_1d0;
  string local_1b8;
  SyntaxKind local_198 [16];
  Expectation local_178;
  Expectation local_c0;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"\nint _ ( )\n{\n    typedef int x ;\n    x * y ;\n}\n",&local_1e9
            );
  Expectation::Expectation(&local_178);
  local_198[0] = DeclarationStatement;
  local_198[1] = TypedefDeclaration;
  local_198[2] = TypedefStorageClass;
  local_198[3] = BasicTypeSpecifier;
  local_198[4] = IdentifierDeclarator;
  local_198[5] = DeclarationStatement;
  local_198[6] = VariableAndOrFunctionDeclaration;
  local_198[7] = TypedefName;
  local_198[8] = PointerDeclarator;
  local_198[9] = IdentifierDeclarator;
  __l._M_len = 10;
  __l._M_array = local_198;
  std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::vector
            ((vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *)&local_1e8,__l,
             &local_1ea);
  preamble_clean((vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *)&local_1d0,
                 (vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *)&local_1e8);
  pEVar1 = Expectation::AST(&local_178,
                            (vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *)
                            &local_1d0);
  Expectation::Expectation(&local_c0,pEVar1);
  reparse_withSyntaxCorrelation(this,&local_1b8,&local_c0);
  Expectation::~Expectation(&local_c0);
  std::_Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::~_Vector_base
            (&local_1d0);
  std::_Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::~_Vector_base
            (&local_1e8);
  Expectation::~Expectation(&local_178);
  std::__cxx11::string::~string((string *)&local_1b8);
  return;
}

Assistant:

void ReparserTester::case0014()
{
    auto s = R"(
int _ ( )
{
    typedef int x ;
    x * y ;
}
)";

    reparse_withSyntaxCorrelation(
                s,
                Expectation().AST(
                    preamble_clean(
                        { SyntaxKind::DeclarationStatement,
                          SyntaxKind::TypedefDeclaration,
                          SyntaxKind::TypedefStorageClass,
                          SyntaxKind::BasicTypeSpecifier,
                          SyntaxKind::IdentifierDeclarator,
                          SyntaxKind::DeclarationStatement,
                          SyntaxKind::VariableAndOrFunctionDeclaration,
                          SyntaxKind::TypedefName,
                          SyntaxKind::PointerDeclarator,
                          SyntaxKind::IdentifierDeclarator })));
}